

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

char * __thiscall
el::base::utils::CommandLineArgs::getParamValue(CommandLineArgs *this,char *paramKey)

{
  bool bVar1;
  char *local_90;
  _Self local_60 [3];
  allocator<char> local_41;
  key_type local_40;
  _Self local_20;
  const_iterator iter;
  char *paramKey_local;
  CommandLineArgs *this_local;
  
  iter._M_node = (_Base_ptr)paramKey;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,paramKey,&local_41);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->m_paramsWithValue,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator(&local_41);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->m_paramsWithValue);
  bVar1 = std::operator!=(&local_20,local_60);
  if (bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_20);
    local_90 = (char *)::std::__cxx11::string::c_str();
  }
  else {
    local_90 = "";
  }
  return local_90;
}

Assistant:

const char* CommandLineArgs::getParamValue(const char* paramKey) const {
  std::map<std::string, std::string>::const_iterator iter = m_paramsWithValue.find(std::string(paramKey));
  return iter != m_paramsWithValue.end() ? iter->second.c_str() : "";
}